

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VCClusterAniso::delItemAdditionalAct(VCClusterAniso *this,VCFace *f)

{
  Matrix<double,_3,_3,_0,_3,_3> *in_RDI;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffffff78;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
  *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff90;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffff98;
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>
  *in_stack_ffffffffffffffa0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffffa8;
  
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffffa8,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffffa0);
  Eigen::Matrix<double,3,3,0,3,3>::operator=(in_RDI,in_stack_ffffffffffffff78);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_&,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_6>_>_>
           *)(in_RDI[4].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + 3);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,other);
  return;
}

Assistant:

void VCClusterAniso::delItemAdditionalAct(VCFace* f) {
	sumK = sumK - f->K;
	sumKPos = sumKPos - f->K * f->center;
}